

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::PrimitiveInstanceSymbol::serializeTo
          (PrimitiveInstanceSymbol *this,ASTSerializer *serializer)

{
  bool bVar1;
  TimingControl *__n;
  ASTSerializer *in_RSI;
  Symbol *in_RDI;
  string_view sVar2;
  ASTSerializer *unaff_retaddr;
  string_view in_stack_00000008;
  type *ds1;
  type *ds0;
  TimingControl *delayCtrl;
  Expression *expr;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  PrimitiveInstanceSymbol *in_stack_00000380;
  Expression *in_stack_fffffffffffffef8;
  PrimitiveInstanceSymbol *in_stack_ffffffffffffff00;
  ASTSerializer *pAVar3;
  ASTSerializer *in_stack_ffffffffffffff08;
  ASTSerializer *this_00;
  size_t local_d8;
  int local_c8;
  void *local_c0;
  size_t local_b8;
  int local_a8;
  void *local_a0;
  int local_78;
  void *local_70;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_50;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_48;
  PrimitiveInstanceSymbol *this_01;
  Symbol *value;
  
  this_00 = in_RSI;
  value = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff08);
  ASTSerializer::writeLink(unaff_retaddr,in_stack_00000008,value);
  pAVar3 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
             (char *)in_stack_ffffffffffffff08);
  sVar2._M_str = (char *)in_RDI;
  sVar2._M_len = (size_t)pAVar3;
  ASTSerializer::startArray(this_00,sVar2);
  local_48 = getPortConnections(in_stack_00000380);
  this_01 = (PrimitiveInstanceSymbol *)&local_48;
  local_50._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffef8);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffff08);
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff00,
                            (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffef8), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator*(&local_50);
    ASTSerializer::serialize((ASTSerializer *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_50);
  }
  ASTSerializer::endArray((ASTSerializer *)0x4562ed);
  __n = getDelay(this_01);
  if (__n != (TimingControl *)0x0) {
    in_stack_ffffffffffffff08 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RSI);
    ASTSerializer::write(in_stack_ffffffffffffff08,local_78,local_70,(size_t)__n);
  }
  getDriveStrength(in_stack_ffffffffffffff00);
  std::get<0ul,std::optional<slang::ast::DriveStrength>,std::optional<slang::ast::DriveStrength>>
            ((pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>
              *)0x456374);
  std::get<1ul,std::optional<slang::ast::DriveStrength>,std::optional<slang::ast::DriveStrength>>
            ((pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>
              *)0x456386);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::DriveStrength> *)0x456395);
  if (bVar1) {
    pAVar3 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
               (char *)in_stack_ffffffffffffff08);
    std::optional<slang::ast::DriveStrength>::operator*
              ((optional<slang::ast::DriveStrength> *)0x4563c3);
    sVar2 = ast::toString(Supply);
    local_b8 = sVar2._M_len;
    ASTSerializer::write(pAVar3,local_a8,local_a0,local_b8);
  }
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::DriveStrength> *)0x4563fc);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
               (char *)in_stack_ffffffffffffff08);
    std::optional<slang::ast::DriveStrength>::operator*
              ((optional<slang::ast::DriveStrength> *)0x456429);
    sVar2 = ast::toString(Supply);
    local_d8 = sVar2._M_len;
    ASTSerializer::write(in_RSI,local_c8,local_c0,local_d8);
  }
  return;
}

Assistant:

void PrimitiveInstanceSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.writeLink("primitiveType", primitiveType);

    serializer.startArray("ports");
    for (auto expr : getPortConnections())
        serializer.serialize(*expr);
    serializer.endArray();

    if (auto delayCtrl = getDelay())
        serializer.write("delay", *delayCtrl);

    auto [ds0, ds1] = getDriveStrength();
    if (ds0)
        serializer.write("driveStrength0", toString(*ds0));
    if (ds1)
        serializer.write("driveStrength1", toString(*ds1));
}